

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O1

string * __thiscall
glcts::GeometryShaderRenderingPointsCase::getGeometryShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderRenderingPointsCase *this)

{
  char *__s;
  ulong uVar1;
  size_t sVar2;
  TestError *this_00;
  
  uVar1 = (ulong)*(uint *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  if (uVar1 < 3) {
    __s = (&PTR_anon_var_dwarf_11740b0_021580c8)[uVar1];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar2);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Requested shader output layout qualifier is unsupported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0x557);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string GeometryShaderRenderingPointsCase::getGeometryShaderCode()
{
	static const char* lines_gs_code = "${VERSION}\n"
									   "\n"
									   "${GEOMETRY_SHADER_ENABLE}\n"
									   "\n"
									   "layout(points)                      in;\n"
									   "layout(line_strip, max_vertices=15) out;\n"
									   "\n"
									   "in  vec4 vs_gs_color[1];\n"
									   "out vec4 gs_fs_color;\n"
									   "\n"
									   "uniform ivec2 renderingTargetSize;\n"
									   "\n"
									   "void main()\n"
									   "{\n"
									   "    float bias = 0.0035;"
									   "    for (int delta = 1; delta <= 3; ++delta)\n"
									   "    {\n"
									   "        float dx = float(delta * 2) / float(renderingTargetSize.x) + bias;\n"
									   "        float dy = float(delta * 2) / float(renderingTargetSize.y) + bias;\n"
									   "\n"
									   /* TL->TR */
									   "        gs_fs_color = vs_gs_color[0];\n"
									   "        gl_Position = gl_in[0].gl_Position + vec4(-dx, -dy, 0, 0);\n"
									   "        EmitVertex();\n"
									   "        gs_fs_color = vs_gs_color[0];\n"
									   "        gl_Position = gl_in[0].gl_Position + vec4(dx, -dy, 0, 0);\n"
									   "        EmitVertex();\n"
									   /* TR->BR */
									   "        gs_fs_color = vs_gs_color[0];\n"
									   "        gl_Position = gl_in[0].gl_Position + vec4(dx, dy, 0, 0);\n"
									   "        EmitVertex();\n"
									   /* BR->BL */
									   "        gs_fs_color = vs_gs_color[0];\n"
									   "        gl_Position = gl_in[0].gl_Position + vec4(-dx, dy, 0, 0);\n"
									   "        EmitVertex();\n"
									   /* BL->TL */
									   "        gs_fs_color = vs_gs_color[0];\n"
									   "        gl_Position = gl_in[0].gl_Position + vec4(-dx, -dy, 0, 0);\n"
									   "        EmitVertex();\n"
									   "        EndPrimitive();\n"
									   "    }\n"
									   "}\n";

	static const char* points_gs_code = "${VERSION}\n"
										"\n"
										"${GEOMETRY_SHADER_ENABLE}\n"
										"\n"
										"layout(points)                 in;\n"
										"layout(points, max_vertices=9) out;\n"
										"\n"
										"in  vec4 vs_gs_color[1];\n"
										"out vec4 gs_fs_color;\n"
										"\n"
										"uniform ivec2 renderingTargetSize;\n"
										"\n"
										"void main()\n"
										"{\n"
										"    float dx = 2.0 / float(renderingTargetSize.x);\n"
										"    float dy = 2.0 / float(renderingTargetSize.y);\n"
										"\n"
										/* TL */
										"    gs_fs_color  = vs_gs_color[0];\n"
										"    gl_Position  = gl_in[0].gl_Position + vec4(-dx, -dy, 0, 0);\n"
										"    EmitVertex();\n"
										/* TM */
										"    gs_fs_color  = vs_gs_color[0];\n"
										"    gl_Position  = gl_in[0].gl_Position + vec4(0, -dy, 0, 0);\n"
										"    EmitVertex();\n"
										/* TR */
										"    gs_fs_color  = vs_gs_color[0];\n"
										"    gl_Position  = gl_in[0].gl_Position + vec4(dx, -dy, 0, 0);\n"
										"    EmitVertex();\n"
										/* L */
										"    gs_fs_color  = vs_gs_color[0];\n"
										"    gl_Position  = gl_in[0].gl_Position + vec4(-dx, 0, 0, 0); \n"
										"    EmitVertex();\n"
										/* M */
										"    gs_fs_color  = vs_gs_color[0];\n"
										"    gl_Position  = gl_in[0].gl_Position;\n"
										"    EmitVertex();\n"
										/* R */
										"    gs_fs_color  = vs_gs_color[0];\n"
										"    gl_Position  = gl_in[0].gl_Position + vec4(dx, 0, 0, 0);\n"
										"    EmitVertex();\n"
										/* BL */
										"    gs_fs_color  = vs_gs_color[0];\n"
										"    gl_Position  = gl_in[0].gl_Position + vec4(-dx, dy, 0, 0);\n"
										"    EmitVertex();\n"
										/* BM */
										"    gs_fs_color  = vs_gs_color[0];\n"
										"    gl_Position  = gl_in[0].gl_Position + vec4(0, dy, 0, 0);\n"
										"    EmitVertex();\n"
										/* BR */
										"    gs_fs_color  = vs_gs_color[0];\n"
										"    gl_Position  = gl_in[0].gl_Position + vec4(dx, dy, 0, 0);\n"
										"    EmitVertex();\n"
										"}\n";

	static const char* triangles_gs_code = "${VERSION}\n"
										   "\n"
										   "${GEOMETRY_SHADER_ENABLE}\n"
										   "\n"
										   "layout(points)                          in;\n"
										   "layout(triangle_strip, max_vertices=6) out;\n"
										   "\n"
										   "in  vec4 vs_gs_color[1];\n"
										   "out vec4 gs_fs_color;\n"
										   "\n"
										   "uniform ivec2 renderingTargetSize;\n"
										   "\n"
										   "void main()\n"
										   "{\n"
										   /* Assume that point position corresponds to TL corner. */
										   "    float dx = float(2.0) / float(renderingTargetSize.x);\n"
										   "    float dy = float(2.0) / float(renderingTargetSize.y);\n"
										   "\n"
										   /* BL 1 */
										   "    gs_fs_color = vec4(vs_gs_color[0].x, 0, 0, 0);\n"
										   "    gl_Position = gl_in[0].gl_Position + vec4(0, 6.0 * dy, 0, 0);\n"
										   "    EmitVertex();\n"
										   /* TL 1 */
										   "    gs_fs_color = vec4(vs_gs_color[0].x, 0, 0, 0);\n"
										   "    gl_Position = gl_in[0].gl_Position;\n"
										   "    EmitVertex();\n"
										   /* BR 1 */
										   "    gs_fs_color = vec4(vs_gs_color[0].x, 0, 0, 0);\n"
										   "    gl_Position = gl_in[0].gl_Position + vec4(6.0 * dx, 6.0 * dy, 0, 0);\n"
										   "    EmitVertex();\n"
										   "    EndPrimitive();\n"
										   /* BR 2 */
										   "    gs_fs_color = vec4(0, vs_gs_color[0].y, 0, 0);\n"
										   "    gl_Position = gl_in[0].gl_Position + vec4(6.0 * dx, 6.0 * dy, 0, 0);\n"
										   "    EmitVertex();\n"
										   /* TL 2 */
										   "    gs_fs_color = vec4(0, vs_gs_color[0].y, 0, 0);\n"
										   "    gl_Position = gl_in[0].gl_Position;\n"
										   "    EmitVertex();\n"
										   /* TR 2 */
										   "    gs_fs_color = vec4(0, vs_gs_color[0].y, 0, 0);\n"
										   "    gl_Position = gl_in[0].gl_Position + vec4(6.0 * dx, 0, 0, 0);\n"
										   "    EmitVertex();\n"
										   "    EndPrimitive();\n"
										   "}\n";
	const char* result = NULL;

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		result = lines_gs_code;

		break;
	}

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		result = points_gs_code;

		break;
	}

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		result = triangles_gs_code;

		break;
	}

	default:
	{
		TCU_FAIL("Requested shader output layout qualifier is unsupported");
	}
	} /* switch (m_output_type) */

	return result;
}